

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Serialize<DataStream,std::pair<std::__cxx11::string,uint256>,std::pair<unsigned_int,unsigned_int>>
               (DataStream *os,
               pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>,_std::pair<unsigned_int,_unsigned_int>_>
               *item)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<DataStream,std::__cxx11::string,uint256>(os,&item->first);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    Serialize<DataStream,unsigned_int,unsigned_int>(os,&item->second);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::pair<K, T>& item)
{
    Serialize(os, item.first);
    Serialize(os, item.second);
}